

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall
Table::Table(Table *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input_columns)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_types,_int>_> *this_00;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_types,_int>_> *p_Var4;
  int local_28;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *input_columns_local;
  Table *this_local;
  
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
  ::vector(&this->columns);
  std::
  vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector(&this->int_cols);
  std::
  vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&this->float_cols);
  std::
  vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector(&this->string_cols);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(input_columns);
  this->cols = (int)sVar1;
  this->rows = 0;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
  ::resize(&this->columns,(long)this->cols);
  for (local_28 = 0; local_28 < this->cols; local_28 = local_28 + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](input_columns,(long)local_28);
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)local_28);
    this_00 = std::get<0ul,std::__cxx11::string,Table::types,int>(pvVar3);
    std::__cxx11::string::operator=((string *)this_00,(string *)pvVar2);
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)local_28);
    p_Var4 = std::get<1ul,std::__cxx11::string,Table::types,int>(pvVar3);
    *p_Var4 = UNDEFINED;
  }
  return;
}

Assistant:

Table::Table(const std::vector<std::string> &input_columns) {
    cols = (int) input_columns.size();
    rows = 0;
    columns.resize(cols);
    for (int i = 0; i < cols; ++i) {
        std::get<0>(columns[i]) = input_columns[i];
        std::get<1>(columns[i]) = UNDEFINED;
    }
}